

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.cpp
# Opt level: O3

IOHANDLE __thiscall
CStorage::OpenFile(CStorage *this,char *pFilename,int Flags,int Type,char *pBuffer,int BufferSize,
                  FCheckCallback pfnCheckCB,void *pCheckCBData)

{
  bool bVar1;
  int iVar2;
  IOHANDLE io;
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  char (*pacVar6) [512];
  char *buffer;
  int buffer_size;
  long in_FS_OFFSET;
  char local_238 [512];
  long local_38;
  
  buffer_size = 0x200;
  if (pBuffer != (char *)0x0) {
    buffer_size = BufferSize;
  }
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  buffer = local_238;
  if (pBuffer != (char *)0x0) {
    buffer = pBuffer;
  }
  iVar2 = str_path_unsafe(pFilename);
  if (iVar2 != 0) {
    io = (IOHANDLE)0x0;
    dbg_msg("storage",
            "refusing to open path which looks like it could escape those specified in \'storage.cfg\': %s"
            ,pFilename);
    goto LAB_001cba9c;
  }
  if ((Flags & 2U) != 0) {
    pcVar5 = "/";
    if (this->m_aaStoragePaths[0][0] == '\0') {
      pcVar5 = "";
    }
    str_format(buffer,buffer_size,"%s%s%s",this->m_aaStoragePaths,pcVar5,pFilename);
    io = io_open(buffer,Flags);
    goto LAB_001cba9c;
  }
  iVar2 = this->m_NumPaths;
  if (Type < iVar2 && -1 < Type) {
    uVar4 = (ulong)(uint)Type;
    iVar2 = Type + 1;
LAB_001cba0f:
    pacVar6 = this->m_aaStoragePaths + uVar4;
    do {
      pcVar5 = "";
      if ((*pacVar6)[0] != '\0') {
        pcVar5 = "/";
      }
      str_format(buffer,buffer_size,"%s%s%s",pacVar6,pcVar5,pFilename);
      io = io_open(buffer,Flags);
      if (io != (IOHANDLE)0x0) {
        if (pfnCheckCB == (FCheckCallback)0x0) goto LAB_001cba9c;
        bVar1 = (*pfnCheckCB)(io,pCheckCBData);
        if (bVar1) goto LAB_001cba9c;
        io_close(io);
      }
      pacVar6 = pacVar6 + 1;
      uVar3 = (int)uVar4 + 1;
      uVar4 = (ulong)uVar3;
    } while ((int)uVar3 < iVar2);
  }
  else {
    dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/engine/shared/storage.cpp"
                   ,0x173,(uint)(Type == -1),"invalid storage type");
    if (0 < iVar2) {
      uVar4 = 0;
      goto LAB_001cba0f;
    }
  }
  *buffer = '\0';
  io = (IOHANDLE)0x0;
LAB_001cba9c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return io;
  }
  __stack_chk_fail();
}

Assistant:

virtual IOHANDLE OpenFile(const char *pFilename, int Flags, int Type, char *pBuffer = 0, int BufferSize = 0, FCheckCallback pfnCheckCB = 0, const void *pCheckCBData = 0)
	{
		char aBuffer[IO_MAX_PATH_LENGTH];
		if(!pBuffer)
		{
			pBuffer = aBuffer;
			BufferSize = sizeof(aBuffer);
		}

		// Check whether the path contains '..' (parent directory) paths. We'd
		// normally still have to check whether it is an absolute path
		// (starts with a path separator (or a drive name on windows)),
		// but since we concatenate this path with another path later
		// on, this can't become absolute.
		//
		// E. g. "/etc/passwd" => "/path/to/storage//etc/passwd", which
		// is safe.
		if(str_path_unsafe(pFilename) != 0)
		{
			dbg_msg("storage", "refusing to open path which looks like it could escape those specified in 'storage.cfg': %s", pFilename);
			return 0;
		}

		// open file
		if(Flags&IOFLAG_WRITE)
		{
			return io_open(GetPath(TYPE_SAVE, pFilename, pBuffer, BufferSize), Flags);
		}
		else
		{
			IOHANDLE Handle = 0;
			int LB = 0, UB = m_NumPaths;	// check all available directories

			if(Type >= 0 && Type < m_NumPaths)	// check wanted directory
			{
				LB = Type;
				UB = Type + 1;
			}
			else
				dbg_assert(Type == TYPE_ALL, "invalid storage type");

			for(int i = LB; i < UB; ++i)
			{
				Handle = io_open(GetPath(i, pFilename, pBuffer, BufferSize), Flags);
				if(Handle)
				{
					// do an additional check on the file
					if(pfnCheckCB && !pfnCheckCB(Handle, pCheckCBData))
					{
						io_close(Handle);
						Handle = 0;
					}
					else
						return Handle;
				}
			}
		}

		pBuffer[0] = 0;
		return 0;
	}